

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O3

void __thiscall cs::extension::extension(extension *this,string *path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  dll *this_00;
  code *pcVar5;
  long *plVar6;
  runtime_error *prVar7;
  size_type *psVar8;
  int __oflag;
  double dVar9;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  name_space::name_space(&this->super_name_space);
  (this->super_name_space)._vptr_name_space = (_func_int **)&PTR__name_space_0024d0f0;
  this_00 = (dll *)operator_new(8);
  this_00->m_handle = (void *)0x0;
  cov::dll::open(this_00,(char *)path,__oflag);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = this_00;
  local_90._M_dataplus._M_p = (pointer)this_00;
  phmap::priv::
  raw_hash_set<phmap::priv::FlatHashSetPolicy<cov::dll*>,phmap::priv::HashEq<cov::dll*,void>::Hash,phmap::priv::HashEq<cov::dll*,void>::Eq,std::allocator<cov::dll*>>
  ::emplace_decomposable<cov::dll*,cov::dll*>
            ((pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<cov::dll_*>,_phmap::priv::HashEq<cov::dll_*,_void>::Hash,_phmap::priv::HashEq<cov::dll_*,_void>::Eq,_std::allocator<cov::dll_*>_>::iterator,_bool>
              *)&local_f0,
             (raw_hash_set<phmap::priv::FlatHashSetPolicy<cov::dll*>,phmap::priv::HashEq<cov::dll*,void>::Hash,phmap::priv::HashEq<cov::dll*,void>::Eq,std::allocator<cov::dll*>>
              *)&gc,(dll **)&local_90,
             SUB168(auVar2 * ZEXT816(0xde5fb9d2630458e9),8) +
             SUB168(auVar2 * ZEXT816(0xde5fb9d2630458e9),0),(dll **)&local_90);
  paVar1 = &local_f0.field_2;
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"__CS_ABI_COMPATIBLE__","");
  pcVar5 = (code *)cov::dll::get_address(this_00,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (pcVar5 != (code *)0x0) {
    iVar3 = (*pcVar5)();
    if (iVar3 != 0) {
      iVar4 = -iVar3;
      if (0 < iVar3) {
        iVar4 = iVar3;
      }
      dVar9 = log10((double)iVar4);
      iVar4 = 3;
      if (3 < (int)dVar9) {
        iVar4 = (int)dVar9;
      }
      dVar9 = pow(10.0,(double)(iVar4 + -3));
      if (iVar3 / (int)dVar9 == 0x8ff) {
        local_f0._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_f0,"__CS_EXTENSION_MAIN__","");
        pcVar5 = (code *)cov::dll::get_address(this_00,&local_f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != paVar1) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        if (pcVar5 != (code *)0x0) {
          (*pcVar5)(this,current_process);
          return;
        }
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x28);
        local_f0._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_f0,"Broken Covariant Script Extension.","");
        runtime_error::runtime_error(prVar7,&local_f0);
        __cxa_throw(prVar7,&runtime_error::typeinfo,runtime_error::~runtime_error);
      }
    }
  }
  prVar7 = (runtime_error *)__cxa_allocate_exception(0x28);
  iVar3 = (*pcVar5)();
  std::__cxx11::to_string(&local_b0,iVar3);
  std::operator+(&local_50,"Incompatible Covariant Script Extension.(Target: ",&local_b0);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_d0._M_dataplus._M_p = (pointer)*plVar6;
  psVar8 = (size_type *)(plVar6 + 2);
  if ((size_type *)local_d0._M_dataplus._M_p == psVar8) {
    local_d0.field_2._M_allocated_capacity = *psVar8;
    local_d0.field_2._8_8_ = plVar6[3];
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar8;
  }
  local_d0._M_string_length = plVar6[1];
  *plVar6 = (long)psVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::to_string(&local_70,0x383a4);
  std::operator+(&local_90,&local_d0,&local_70);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_90);
  local_f0._M_dataplus._M_p = (pointer)*plVar6;
  psVar8 = (size_type *)(plVar6 + 2);
  if ((size_type *)local_f0._M_dataplus._M_p == psVar8) {
    local_f0.field_2._M_allocated_capacity = *psVar8;
    local_f0.field_2._8_8_ = plVar6[3];
    local_f0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_f0.field_2._M_allocated_capacity = *psVar8;
  }
  local_f0._M_string_length = plVar6[1];
  *plVar6 = (long)psVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  runtime_error::runtime_error(prVar7,&local_f0);
  __cxa_throw(prVar7,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

explicit extension(const std::string &path)
		{
			using namespace dll_resources;
			cov::dll *dll = new cov::dll(path);
			gc.add(dll);
			dll_compatible_check_t dll_check = reinterpret_cast<dll_compatible_check_t>(dll->get_address(
			                                       dll_compatible_check));
			if (dll_check == nullptr || truncate(dll_check(), 4) != truncate(COVSCRIPT_ABI_VERSION, 4))
				throw runtime_error("Incompatible Covariant Script Extension.(Target: " + std::to_string(dll_check()) +
				                    ", Current: " + std::to_string(COVSCRIPT_ABI_VERSION) + ")");
			dll_main_entrance_t dll_main = reinterpret_cast<dll_main_entrance_t>(dll->get_address(dll_main_entrance));
			if (dll_main != nullptr) {
				dll_main(this, current_process);
			}
			else
				throw runtime_error("Broken Covariant Script Extension.");
		}